

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_yang.c
# Opt level: O3

LY_ERR parse_refine(lysp_yang_ctx *ctx,lysp_refine **refines)

{
  lysp_ext_instance **exts;
  lysp_refine *plVar1;
  lyd_node *plVar2;
  size_t len;
  LY_ERR LVar3;
  long *plVar4;
  long lVar5;
  char *pcVar6;
  uint16_t *puVar7;
  char *format;
  lysp_restr **extraout_RDX;
  lysp_restr **restrs;
  lysp_qname **qnames;
  lysp_restr **extraout_RDX_00;
  ly_ctx *plVar8;
  ly_stmt lVar9;
  void *parent;
  lysp_ext_instance **exts_00;
  lysp_qname **pplVar10;
  char **str_p;
  ly_stmt kw;
  char *word;
  size_t word_len;
  char *buf;
  undefined4 in_stack_ffffffffffffff70;
  ly_stmt in_stack_ffffffffffffff74;
  char *local_88;
  size_t local_80;
  uint16_t *local_78;
  lysp_qname **local_70;
  uint16_t *local_68;
  uint32_t *local_60;
  uint32_t *local_58;
  uint16_t *local_50;
  uint16_t *local_48;
  uint16_t *local_40;
  lysp_ext_instance *local_38;
  
  plVar1 = *refines;
  if (plVar1 == (lysp_refine *)0x0) {
    plVar4 = (long *)malloc(0x58);
    if (plVar4 == (long *)0x0) goto LAB_00178a03;
    *plVar4 = 1;
    lVar5 = 1;
  }
  else {
    lVar5 = *(long *)&plVar1[-1].flags;
    *(long *)&plVar1[-1].flags = lVar5 + 1;
    plVar4 = (long *)realloc(&plVar1[-1].flags,lVar5 * 0x50 + 0x58);
    if (plVar4 == (long *)0x0) {
      *(long *)&(*refines)[-1].flags = *(long *)&(*refines)[-1].flags + -1;
LAB_00178a03:
      if (ctx == (lysp_yang_ctx *)0x0) {
        plVar8 = (ly_ctx *)0x0;
      }
      else {
        plVar8 = (ly_ctx *)
                 **(undefined8 **)(ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
      }
      ly_log(plVar8,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).","parse_refine");
      return LY_EMEM;
    }
    lVar5 = *plVar4;
  }
  *refines = (lysp_refine *)(plVar4 + 1);
  plVar4[lVar5 * 10 + -1] = 0;
  (plVar4 + lVar5 * 10 + -1)[1] = 0;
  plVar4[lVar5 * 10 + -3] = 0;
  (plVar4 + lVar5 * 10 + -3)[1] = 0;
  plVar4[lVar5 * 10 + -5] = 0;
  (plVar4 + lVar5 * 10 + -5)[1] = 0;
  plVar4[lVar5 * 10 + -7] = 0;
  (plVar4 + lVar5 * 10 + -7)[1] = 0;
  plVar4[lVar5 * 10 + -9] = 0;
  (plVar4 + lVar5 * 10 + -9)[1] = 0;
  exts_00 = &local_38;
  LVar3 = get_argument(ctx,Y_STR_ARG,(uint16_t *)0x0,&local_88,(char **)exts_00,&local_80);
  len = local_80;
  if (LVar3 == LY_SUCCESS) {
    if (local_80 == 0) {
      if (ctx == (lysp_yang_ctx *)0x0) {
        plVar8 = (ly_ctx *)0x0;
      }
      else {
        plVar8 = (ly_ctx *)
                 **(undefined8 **)(ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
      }
      exts_00 = (lysp_ext_instance **)0x1d6da5;
      ly_log(plVar8,LY_LLWRN,LY_SUCCESS,"Empty argument of %s statement does not make sense.");
    }
    str_p = (char **)(plVar4 + lVar5 * 10 + -9);
    if (local_38 == (lysp_ext_instance *)0x0) {
      if (ctx == (lysp_yang_ctx *)0x0) {
        plVar8 = (ly_ctx *)0x0;
      }
      else {
        plVar8 = (ly_ctx *)
                 **(undefined8 **)(ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
      }
      pcVar6 = local_88;
      if (len == 0) {
        pcVar6 = "";
      }
      LVar3 = lydict_insert(plVar8,pcVar6,len,str_p);
    }
    else {
      if (ctx == (lysp_yang_ctx *)0x0) {
        plVar8 = (ly_ctx *)0x0;
      }
      else {
        plVar8 = (ly_ctx *)
                 **(undefined8 **)(ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
      }
      LVar3 = lydict_insert_zc(plVar8,local_88,str_p);
    }
    if (((LVar3 == LY_SUCCESS) &&
        (LVar3 = get_keyword(ctx,(ly_stmt *)&stack0xffffffffffffff74,&local_88,&local_80),
        LVar3 == LY_SUCCESS)) &&
       (LVar3 = LY_SUCCESS, in_stack_ffffffffffffff74 != LY_STMT_SYNTAX_SEMICOLON)) {
      if (in_stack_ffffffffffffff74 == LY_STMT_SYNTAX_LEFT_BRACE) {
        LVar3 = get_keyword(ctx,(ly_stmt *)&stack0xffffffffffffff74,&local_88,&local_80);
        if ((LVar3 == LY_SUCCESS) &&
           (LVar3 = LY_SUCCESS, in_stack_ffffffffffffff74 != LY_STMT_SYNTAX_RIGHT_BRACE)) {
          local_78 = (uint16_t *)(plVar4 + lVar5 * 10);
          exts = (lysp_ext_instance **)(local_78 + -4);
          local_40 = local_78 + -0x10;
          local_48 = local_78 + -0x1c;
          local_50 = local_78 + -0x14;
          local_58 = (uint32_t *)(local_78 + -8);
          local_60 = (uint32_t *)(local_78 + -6);
          local_70 = (lysp_qname **)(local_78 + -0x18);
          local_68 = local_78 + -0x20;
          pplVar10 = (lysp_qname **)(local_78 + -0xc);
          restrs = extraout_RDX;
          do {
            if ((int)in_stack_ffffffffffffff74 < 0x180000) {
              if ((int)in_stack_ffffffffffffff74 < 0x80000) {
                if (in_stack_ffffffffffffff74 == LY_STMT_CONFIG) {
                  LVar3 = parse_config(ctx,local_78,exts);
                }
                else {
                  if (in_stack_ffffffffffffff74 != LY_STMT_DEFAULT) {
LAB_00178e2f:
                    if (ctx == (lysp_yang_ctx *)0x0) {
                      plVar8 = (ly_ctx *)0x0;
                    }
                    else {
                      plVar8 = (ly_ctx *)
                               **(undefined8 **)
                                 (ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
                    }
                    pcVar6 = lyplg_ext_stmt2str(in_stack_ffffffffffffff74);
                    format = "Invalid keyword \"%s\" as a child of \"%s\".";
                    goto LAB_00178e93;
                  }
                  lVar9 = LY_STMT_DEFAULT;
                  qnames = pplVar10;
LAB_00178ccd:
                  LVar3 = parse_qnames(ctx,lVar9,qnames,(yang_arg)exts,exts_00);
                }
              }
              else {
                if (in_stack_ffffffffffffff74 == LY_STMT_DESCRIPTION) {
                  parent = *(void **)local_68;
                  lVar9 = LY_STMT_DESCRIPTION;
                  puVar7 = local_68;
                  goto LAB_00178d42;
                }
                if (in_stack_ffffffffffffff74 != LY_STMT_EXTENSION_INSTANCE) {
                  if (in_stack_ffffffffffffff74 != LY_STMT_IF_FEATURE) goto LAB_00178e2f;
                  plVar2 = (ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
                  if (1 < *(byte *)&plVar2[2].schema) {
                    lVar9 = LY_STMT_IF_FEATURE;
                    qnames = local_70;
                    goto LAB_00178ccd;
                  }
                  plVar8 = (ly_ctx *)**(undefined8 **)plVar2;
                  format = 
                  "Invalid keyword \"%s\" as a child of \"%s\" - the statement is allowed only in YANG 1.1 modules."
                  ;
                  pcVar6 = "if-feature";
LAB_00178e93:
                  ly_vlog(plVar8,(char *)0x0,LYVE_SYNTAX_YANG,format,pcVar6,"refine");
                  goto LAB_00178e24;
                }
                exts_00 = (lysp_ext_instance **)0x280000;
                LVar3 = parse_ext(ctx,local_88,local_80,str_p,LY_STMT_REFINE,0,exts);
              }
            }
            else if ((int)in_stack_ffffffffffffff74 < 0x1d0000) {
              if (in_stack_ffffffffffffff74 == LY_STMT_MANDATORY) {
                LVar3 = parse_mandatory(ctx,local_78,exts);
              }
              else if (in_stack_ffffffffffffff74 == LY_STMT_MAX_ELEMENTS) {
                LVar3 = parse_maxelements(ctx,local_60,local_78,exts);
              }
              else {
                if (in_stack_ffffffffffffff74 != LY_STMT_MIN_ELEMENTS) goto LAB_00178e2f;
                LVar3 = parse_minelements(ctx,local_58,local_78,exts);
              }
            }
            else if (in_stack_ffffffffffffff74 == LY_STMT_MUST) {
              LVar3 = parse_restrs(ctx,(ly_stmt)local_50,restrs);
            }
            else {
              if (in_stack_ffffffffffffff74 == LY_STMT_PRESENCE) {
                parent = *(void **)local_40;
                lVar9 = LY_STMT_PRESENCE;
                puVar7 = local_40;
              }
              else {
                if (in_stack_ffffffffffffff74 != LY_STMT_REFERENCE) goto LAB_00178e2f;
                parent = *(void **)local_48;
                lVar9 = LY_STMT_REFERENCE;
                puVar7 = local_48;
              }
LAB_00178d42:
              exts_00 = (lysp_ext_instance **)0x2;
              LVar3 = parse_text_field(ctx,parent,lVar9,(uint32_t)puVar7,(char **)0x2,Y_IDENTIF_ARG,
                                       (uint16_t *)exts,
                                       (lysp_ext_instance **)
                                       CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70)
                                      );
            }
            if (LVar3 != LY_SUCCESS) {
              return LVar3;
            }
            LVar3 = get_keyword(ctx,(ly_stmt *)&stack0xffffffffffffff74,&local_88,&local_80);
            if (LVar3 != LY_SUCCESS) {
              return LVar3;
            }
            restrs = extraout_RDX_00;
          } while (in_stack_ffffffffffffff74 != LY_STMT_SYNTAX_RIGHT_BRACE);
          if ((*exts == (lysp_ext_instance *)0x0) ||
             (LVar3 = ly_set_add(&ctx->main_ctx->ext_inst,*exts,'\x01',(uint32_t *)0x0),
             LVar3 == LY_SUCCESS)) {
            LVar3 = LY_SUCCESS;
          }
        }
      }
      else {
        if (ctx == (lysp_yang_ctx *)0x0) {
          plVar8 = (ly_ctx *)0x0;
        }
        else {
          plVar8 = (ly_ctx *)
                   **(undefined8 **)(ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
        }
        pcVar6 = lyplg_ext_stmt2str(in_stack_ffffffffffffff74);
        ly_vlog(plVar8,(char *)0x0,LYVE_SYNTAX_YANG,
                "Invalid keyword \"%s\", expected \";\" or \"{\".",pcVar6);
LAB_00178e24:
        LVar3 = LY_EVALID;
      }
    }
  }
  return LVar3;
}

Assistant:

static LY_ERR
parse_refine(struct lysp_yang_ctx *ctx, struct lysp_refine **refines)
{
    LY_ERR ret = LY_SUCCESS;
    char *buf, *word;
    size_t word_len;
    enum ly_stmt kw;
    struct lysp_refine *rf;

    LY_ARRAY_NEW_RET(PARSER_CTX(ctx), *refines, rf, LY_EMEM);

    /* get value */
    LY_CHECK_RET(get_argument(ctx, Y_STR_ARG, NULL, &word, &buf, &word_len));
    CHECK_NONEMPTY(ctx, word_len, "refine");
    INSERT_WORD_GOTO(ctx, buf, rf->nodeid, word, word_len, ret, cleanup);

    YANG_READ_SUBSTMT_FOR_GOTO(ctx, kw, word, word_len, ret, cleanup) {
        switch (kw) {
        case LY_STMT_CONFIG:
            LY_CHECK_RET(parse_config(ctx, &rf->flags, &rf->exts));
            break;
        case LY_STMT_DEFAULT:
            LY_CHECK_RET(parse_qnames(ctx, LY_STMT_DEFAULT, &rf->dflts, Y_STR_ARG, &rf->exts));
            break;
        case LY_STMT_DESCRIPTION:
            LY_CHECK_RET(parse_text_field(ctx, rf->dsc, LY_STMT_DESCRIPTION, 0, &rf->dsc, Y_STR_ARG, NULL, &rf->exts));
            break;
        case LY_STMT_IF_FEATURE:
            PARSER_CHECK_STMTVER2_RET(ctx, "if-feature", "refine");
            LY_CHECK_RET(parse_qnames(ctx, LY_STMT_IF_FEATURE, &rf->iffeatures, Y_STR_ARG, &rf->exts));
            break;
        case LY_STMT_MAX_ELEMENTS:
            LY_CHECK_RET(parse_maxelements(ctx, &rf->max, &rf->flags, &rf->exts));
            break;
        case LY_STMT_MIN_ELEMENTS:
            LY_CHECK_RET(parse_minelements(ctx, &rf->min, &rf->flags, &rf->exts));
            break;
        case LY_STMT_MUST:
            LY_CHECK_RET(parse_restrs(ctx, kw, &rf->musts));
            break;
        case LY_STMT_MANDATORY:
            LY_CHECK_RET(parse_mandatory(ctx, &rf->flags, &rf->exts));
            break;
        case LY_STMT_REFERENCE:
            LY_CHECK_RET(parse_text_field(ctx, rf->ref, LY_STMT_REFERENCE, 0, &rf->ref, Y_STR_ARG, NULL, &rf->exts));
            break;
        case LY_STMT_PRESENCE:
            LY_CHECK_RET(parse_text_field(ctx, rf->presence, LY_STMT_PRESENCE, 0, &rf->presence, Y_STR_ARG, NULL, &rf->exts));
            break;
        case LY_STMT_EXTENSION_INSTANCE:
            LY_CHECK_RET(parse_ext(ctx, word, word_len, rf, LY_STMT_REFINE, 0, &rf->exts));
            break;
        default:
            LOGVAL_PARSER(ctx, LY_VCODE_INCHILDSTMT, lyplg_ext_stmt2str(kw), "refine");
            return LY_EVALID;
        }
        YANG_READ_SUBSTMT_NEXT_ITER(ctx, kw, word, word_len, rf->exts, ret, cleanup);
    }

cleanup:
    return ret;
}